

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

int sendto_buffer_target(buffer_target *target,char *msg,size_t msg_length)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  
  uVar3 = msg_length - 1;
  if (uVar3 < target->size) {
    pthread_lock_mutex(&target->buffer_mutex);
    uVar2 = target->write_position;
    uVar5 = target->size - uVar2;
    if (uVar3 < uVar5) {
      memcpy(target->buffer + uVar2,msg,uVar3);
      sVar4 = target->write_position + msg_length;
    }
    else {
      memcpy(target->buffer + uVar2,msg,uVar5);
      memcpy(target->buffer,msg + uVar5,uVar3 - uVar5);
      sVar4 = (uVar3 - uVar5) + 1;
    }
    target->write_position = sVar4;
    target->buffer[sVar4 - 1] = '\0';
    uVar5 = target->read_position - uVar2;
    if (target->read_position < uVar2 || uVar5 == 0) {
      uVar5 = uVar5 + target->size;
    }
    if (uVar5 <= uVar3) {
      uVar3 = (target->write_position + 1) % target->size;
      target->read_position = uVar3;
      if (target->buffer[uVar3] == '\0') {
        uVar2 = 0;
        if (uVar3 + 1 != target->size) {
          uVar2 = uVar3 + 1;
        }
        target->read_position = uVar2;
      }
    }
    pthread_unlock_mutex(&target->buffer_mutex);
    iVar1 = cap_size_t_to_int(msg_length);
    return iVar1;
  }
  raise_argument_too_big
            ("buffer is too small for the given message",uVar3,
             "the size of the message that was attempted to be sent");
  return -1;
}

Assistant:

int
sendto_buffer_target( struct buffer_target *target,
                      const char *msg,
                      size_t msg_length ) {
  size_t write_start;
  size_t buffer_remaining;
  size_t free_space_left;

  // leave off the newline
  msg_length--;

  if( msg_length >= target->size ) {
    raise_argument_too_big( L10N_BUFFER_TOO_SMALL_ERROR_MESSAGE,
                            msg_length,
                            L10N_MESSAGE_SIZE_ERROR_CODE_TYPE );
    return -1;
  }

  config_lock_mutex( &target->buffer_mutex );
  write_start = target->write_position;
  buffer_remaining = target->size - write_start;

  if( buffer_remaining > msg_length ) {
    // the entire message will fit into the buffer without wrapping around
    memcpy( target->buffer + write_start, msg, msg_length );
    target->write_position += msg_length + 1;

  } else {
    // we need to split the message and wrap it around to the beginning
    memcpy( target->buffer + write_start, msg, buffer_remaining );
    memcpy( target->buffer,
            msg + buffer_remaining,
            msg_length - buffer_remaining );
    target->write_position = msg_length - buffer_remaining + 1;
  }

  target->buffer[target->write_position - 1] = '\0';

  // checking to see if we have overwritten older messages and need to adjust
  // the read position to reflect this
  if( target->read_position > write_start ) {
    free_space_left = target->read_position - write_start;
  } else {
    free_space_left = ( target->size - write_start ) + target->read_position;
  }

  if( free_space_left <= msg_length ) {
    target->read_position = ( target->write_position + 1 ) % target->size;

    if( target->buffer[target->read_position] == '\0' ) {
      target->read_position = ( target->read_position + 1 ) % target->size;
    }
  }

  config_unlock_mutex( &target->buffer_mutex );

  return cap_size_t_to_int( msg_length + 1 );
}